

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uavs3d.c
# Opt level: O0

void init_core_by_frm(com_core_t *core,com_frm_t *frm)

{
  com_frm_t *frm_local;
  com_core_t *core_local;
  
  core->pic = frm->pic;
  (core->bs).cur = frm->bs_buf;
  (core->bs).end = frm->bs_buf + frm->bs_length;
  (core->bs).leftbits = 0;
  (core->bs).code = 0;
  memcpy(core->refp,frm->refp,0x440);
  *(undefined8 *)core->num_refp = *(undefined8 *)frm->num_refp;
  core->pichdr = &frm->pichdr;
  return;
}

Assistant:

void init_core_by_frm(com_core_t *core, com_frm_t *frm)
{
    core->pic = frm->pic;
    core->bs.cur = frm->bs_buf;
    core->bs.end = frm->bs_buf + frm->bs_length;
    core->bs.leftbits = 0;
    core->bs.code = 0;

    memcpy(core->refp, frm->refp, sizeof(frm->refp)); 
    memcpy(core->num_refp, frm->num_refp, sizeof(frm->num_refp));

    core->pichdr = &frm->pichdr;
}